

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

size_t measure_string(uint length,char *str)

{
  int iVar1;
  size_t sStack_28;
  int c;
  size_t measured_length;
  uint i;
  char *str_local;
  uint length_local;
  
  sStack_28 = 0;
  for (measured_length._4_4_ = 0; measured_length._4_4_ < length;
      measured_length._4_4_ = measured_length._4_4_ + 1) {
    iVar1 = (int)str[measured_length._4_4_];
    if ((((iVar1 - 8U < 3) || (iVar1 - 0xcU < 2)) || (iVar1 == 0x22)) || (iVar1 == 0x5c)) {
      sStack_28 = sStack_28 + 2;
    }
    else {
      sStack_28 = sStack_28 + 1;
    }
  }
  return sStack_28;
}

Assistant:

static size_t measure_string (unsigned int length,
                              const char *str)
{
   unsigned int i;
   size_t measured_length = 0;

   for(i = 0; i < length; ++ i)
   {
      int c = str[i];

      switch (c)
      {
      case '"':
      case '\\':
      case '\b':
      case '\f':
      case '\n':
      case '\r':
      case '\t':

         measured_length += 2;
         break;

      default:

         ++ measured_length;
         break;
      };
   };

   return measured_length;
}